

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryCompiler.cpp
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
QueryCompiler::compileViews
          (QueryCompiler *this,TDNode *node,size_t destinationID,
          vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *aggregate,
          var_bitset freeVars)

{
  pointer *ppbVar1;
  pointer *pppVar2;
  pointer *pppAVar3;
  pointer *pppVVar4;
  _WordT *p_Var5;
  ulong *puVar6;
  pointer ppFVar7;
  Function *pFVar8;
  iterator __position;
  iterator __position_00;
  _Hash_node_base *p_Var9;
  iterator __position_01;
  pointer ppAVar10;
  iterator __position_02;
  pointer ppVVar11;
  pointer ppVVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  bool bVar23;
  Aggregate *pAVar24;
  bool bVar25;
  iterator iVar26;
  pointer pbVar27;
  iterator iVar28;
  mapped_type *pmVar29;
  TDNode *node_00;
  iterator iVar30;
  mapped_type *pmVar31;
  mapped_type *pmVar32;
  ulong uVar33;
  pointer pbVar34;
  ulong uVar35;
  long lVar36;
  size_t other;
  unsigned_long uVar37;
  pointer __src;
  _WordT _Var38;
  size_type __n;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  bitset<1500UL> *pbVar42;
  pointer pbVar43;
  size_t sVar44;
  bitset<1500UL> *pbVar45;
  pointer __src_00;
  unsigned_long uVar46;
  bitset<200UL> *pbVar47;
  undefined1 auVar48 [16];
  long lVar49;
  char cVar50;
  ushort uVar51;
  byte bVar61;
  char cVar62;
  byte bVar63;
  char cVar64;
  byte bVar65;
  char cVar66;
  byte bVar67;
  char cVar68;
  byte bVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  pair<unsigned_long,_unsigned_long> pVar72;
  initializer_list<std::bitset<1500UL>_> __l;
  Aggregate *agg;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> pushDownMask;
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> pushDownFreeVars;
  prod_bitset forcedLocal;
  View *view;
  agg_bitset candidate;
  agg_bitset merges;
  unordered_map<std::bitset<1500UL>,_std::bitset<200UL>,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>_>
  localAggMap;
  bitset<1500UL> __result_5;
  prod_bitset presentFunctions;
  prod_bitset forcedLocalFunctions;
  prod_bitset remainderMask;
  prod_bitset localMask;
  ulong local_8a0;
  Aggregate *local_890;
  ulong local_888;
  size_t local_880;
  value_type local_878;
  bitset<1500UL> *local_868;
  bitset<200UL> *local_860;
  _WordT local_858;
  _WordT _Stack_850;
  _WordT local_848;
  _WordT _Stack_840;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> local_830;
  _WordT local_818;
  _WordT _Stack_810;
  _Map_base<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_800;
  _Hash_node_base *local_7f8;
  vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_> local_7f0;
  undefined1 local_7d8 [16];
  undefined1 local_7c8 [16];
  pointer local_7b8;
  size_t local_7b0;
  size_t local_7a8;
  ulong local_720;
  undefined1 local_718 [40];
  _Head_base<1UL,_int,_false> local_6f0;
  undefined4 local_6ec;
  key_type local_6e8;
  _WordT local_628;
  _WordT _Stack_620;
  _WordT local_618;
  _WordT _Stack_610;
  bitset<200UL> local_608;
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [16];
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> local_5c8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  float local_590;
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  undefined1 local_568 [16];
  View *local_4b0;
  ulong auStack_4a8 [23];
  ulong local_3f0 [24];
  bitset<1500UL> local_330;
  undefined1 local_270 [192];
  bitset<1500UL> local_1b0;
  bitset<1500UL> local_f0;
  undefined4 uVar52;
  undefined6 uVar53;
  undefined8 uVar54;
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [14];
  undefined1 auVar58 [14];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  
  local_878.super__Base_bitset<2UL>._M_w[1] = freeVars.super__Base_bitset<2UL>._M_w[1];
  local_878.super__Base_bitset<2UL>._M_w[0] = freeVars.super__Base_bitset<2UL>._M_w[0];
  local_7d8 = (undefined1  [16])freeVars.super__Base_bitset<2UL>._M_w;
  std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
            ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)local_7c8,
             aggregate);
  local_7a8 = node->_id;
  local_6f0._M_head_impl = (int)destinationID;
  local_6ec = (undefined4)local_7a8;
  local_718._16_16_ = local_7c8;
  local_718._8_8_ = local_7d8._8_8_;
  local_718._0_8_ = local_7d8._0_8_;
  local_7b8 = (pointer)0x0;
  local_7c8 = (undefined1  [16])0x0;
  local_880 = destinationID;
  local_7b0 = destinationID;
  iVar26 = std::
           _Hashtable<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->_cache)._M_h,(key_type *)local_718);
  if (iVar26.
      super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_800 = (_Map_base<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->_cache;
    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
              (&local_830,node->_numOfNeighbors,(allocator_type *)local_7d8);
    memset(&local_f0,0,0xc0);
    memset(&local_330,0,0xc0);
    memset(&local_1b0,0,0xc0);
    memset(local_3f0,0,0xc0);
    pbVar27 = (aggregate->
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    pbVar43 = (aggregate->
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    __n = ((long)pbVar43 - (long)pbVar27 >> 6) * -0x5555555555555555;
    if (pbVar43 != pbVar27) {
      lVar36 = 0;
      do {
        lVar39 = 0;
        do {
          *(undefined1 (*) [16])(local_3f0 + lVar39) =
               *(undefined1 (*) [16])(local_3f0 + lVar39) |
               *(undefined1 (*) [16])((pbVar27->super__Base_bitset<24UL>)._M_w + lVar39);
          lVar39 = lVar39 + 2;
        } while (lVar39 != 0x18);
        lVar36 = lVar36 + 1;
        pbVar27 = pbVar27 + 1;
      } while (lVar36 != __n + (__n == 0));
    }
    ppFVar7 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar33 = 0;
    do {
      uVar40 = uVar33 >> 6;
      uVar41 = 1L << ((byte)uVar33 & 0x3f);
      if ((local_3f0[uVar40] >> (uVar33 & 0x3f) & 1) != 0) {
        pFVar8 = ppFVar7[uVar33];
        auVar48 = (undefined1  [16])*&(pFVar8->_fVars).super__Base_bitset<2UL>._M_w &
                  *(undefined1 (*) [16])(node->_bag).super__Base_bitset<2UL>._M_w;
        _Var38 = (pFVar8->_fVars).super__Base_bitset<2UL>._M_w[0];
        if (auVar48._0_8_ == _Var38) {
          bVar25 = false;
          do {
            bVar23 = bVar25;
            pbVar42 = &local_f0;
            if (bVar23) goto LAB_0029f4ac;
            bVar25 = true;
          } while (auVar48._8_8_ == (pFVar8->_fVars).super__Base_bitset<2UL>._M_w[1]);
          if (!bVar23) goto LAB_0029f3f0;
        }
        else {
LAB_0029f3f0:
          pbVar42 = &local_330;
          pbVar45 = &local_f0;
          if (node->_numOfNeighbors != 0) {
            sVar44 = 0;
            do {
              if (((node->_neighbors).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar44] != local_880) &&
                 (auVar48 = (undefined1  [16])*&(pFVar8->_fVars).super__Base_bitset<2UL>._M_w &
                            *(undefined1 (*) [16])
                             node->_neighborSchema[sVar44].super__Base_bitset<2UL>._M_w,
                 auVar48._0_8_ == _Var38)) {
                bVar25 = false;
                do {
                  bVar23 = bVar25;
                  if (bVar23) goto LAB_0029f484;
                  bVar25 = true;
                } while (auVar48._8_8_ == (pFVar8->_fVars).super__Base_bitset<2UL>._M_w[1]);
                if (bVar23) {
LAB_0029f484:
                  pbVar45 = local_830.
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + sVar44;
                  pbVar42 = &local_1b0;
                  goto LAB_0029f49d;
                }
              }
              sVar44 = sVar44 + 1;
            } while (sVar44 != node->_numOfNeighbors);
            pbVar42 = &local_330;
          }
LAB_0029f49d:
          p_Var5 = (pbVar45->super__Base_bitset<24UL>)._M_w + uVar40;
          *p_Var5 = *p_Var5 | uVar41;
        }
LAB_0029f4ac:
        p_Var5 = (pbVar42->super__Base_bitset<24UL>)._M_w + uVar40;
        *p_Var5 = *p_Var5 | uVar41;
      }
      uVar33 = uVar33 + 1;
    } while (uVar33 != 0x5dc);
    std::vector<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>::vector
              (&local_7f0,__n,&local_878,(allocator_type *)local_7d8);
    local_5b0._0_8_ = local_588 + 8;
    local_5b0._8_8_ = 1;
    local_5a0 = (undefined1  [16])0x0;
    local_590 = 1.0;
    local_588 = (undefined1  [16])0x0;
    pbVar27 = (aggregate->
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if ((aggregate->super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
        _M_impl.super__Vector_impl_data._M_finish != pbVar27) {
      uVar33 = 0;
      do {
        memcpy(local_7d8,pbVar27 + uVar33,0xc0);
        lVar36 = 0;
        do {
          uVar40 = local_330.super__Base_bitset<24UL>._M_w[lVar36 + 1];
          uVar41 = *(ulong *)(local_7d8 + lVar36 * 8 + 8);
          *(ulong *)(local_7d8 + lVar36 * 8) =
               *(ulong *)(local_7d8 + lVar36 * 8) & local_330.super__Base_bitset<24UL>._M_w[lVar36];
          *(ulong *)(local_7d8 + lVar36 * 8 + 8) = uVar41 & uVar40;
          lVar36 = lVar36 + 2;
        } while (lVar36 != 0x18);
        ppFVar7 = (this->_functionList).super__Vector_base<Function_*,_std::allocator<Function_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pbVar34 = local_7f0.
                  super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar33;
        uVar40 = 0;
        do {
          if ((*(ulong *)(local_7d8 + (uVar40 >> 6) * 8) >> (uVar40 & 0x3f) & 1) != 0) {
            pFVar8 = ppFVar7[uVar40];
            uVar35 = (node->_bag).super__Base_bitset<2UL>._M_w[1];
            uVar41 = (ulong)DAT_002b26a0;
            uVar14 = *(_WordT *)((long)(pFVar8->_fVars).super__Base_bitset<2UL>._M_w + 8);
            uVar13 = (pbVar34->super__Base_bitset<2UL>)._M_w[1];
            (pbVar34->super__Base_bitset<2UL>)._M_w[0] =
                 (pbVar34->super__Base_bitset<2UL>)._M_w[0] |
                 (pFVar8->_fVars).super__Base_bitset<2UL>._M_w[0] &
                 ((node->_bag).super__Base_bitset<2UL>._M_w[0] ^ 0xffffffffffffffff);
            (pbVar34->super__Base_bitset<2UL>)._M_w[1] =
                 uVar13 | uVar14 & (uVar35 ^ 0xffffffffffffffff) & uVar41;
          }
          uVar40 = uVar40 + 1;
        } while (uVar40 != 0x5dc);
        memcpy(&local_6e8,pbVar27 + uVar33,0xc0);
        lVar36 = 0;
        do {
          *(undefined1 (*) [16])(local_6e8.super__Base_bitset<24UL>._M_w + lVar36) =
               *(undefined1 (*) [16])(local_6e8.super__Base_bitset<24UL>._M_w + lVar36) &
               *(undefined1 (*) [16])(local_f0.super__Base_bitset<24UL>._M_w + lVar36);
          lVar36 = lVar36 + 2;
        } while (lVar36 != 0x18);
        iVar28 = std::
                 _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::find((_Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)local_5b0,&local_6e8);
        if (iVar28.
            super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false>
            ._M_cur == (__node_type *)0x0) {
          local_568 = (undefined1  [16])0x0;
          local_578 = (undefined1  [16])0x0;
          if (199 < uVar33) {
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar33,
                       200);
          }
          *(ulong *)(local_578 + (uVar33 >> 6) * 8) =
               *(ulong *)(local_578 + (uVar33 >> 6) * 8) | 1L << ((byte)uVar33 & 0x3f);
          pmVar29 = std::__detail::
                    _Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)local_5b0,&local_6e8);
          *(undefined1 (*) [16])((pmVar29->super__Base_bitset<4UL>)._M_w + 2) = local_568;
          (pmVar29->super__Base_bitset<4UL>)._M_w[0] = local_578._0_8_;
          (pmVar29->super__Base_bitset<4UL>)._M_w[1] = local_578._8_8_;
        }
        else {
          if (199 < uVar33) {
            std::__throw_out_of_range_fmt
                      ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",uVar33,
                       200);
          }
          puVar6 = (ulong *)((long)iVar28.
                                   super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_false>
                                   ._M_cur + 200 + (uVar33 >> 6) * 8);
          *puVar6 = *puVar6 | 1L << ((byte)uVar33 & 0x3f);
        }
        uVar33 = uVar33 + 1;
        pbVar27 = (aggregate->
                  super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar33 < (ulong)(((long)(aggregate->
                                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar27
                                >> 6) * -0x5555555555555555));
    }
    local_890 = (Aggregate *)operator_new(0x30);
    (local_890->_incoming).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_890->_incoming).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined1 (*) [16])
     &(local_890->_agg).
      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
    (local_890->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (local_890->_agg).super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    p_Var9 = (_Hash_node_base *)local_5a0._0_8_;
    while (p_Var9 != (_Hash_node_base *)0x0) {
      local_868 = (bitset<1500UL> *)(p_Var9 + 1);
      pbVar47 = (bitset<200UL> *)(p_Var9 + 0x19);
      uVar33 = 0;
      local_860 = pbVar47;
      local_7f8 = p_Var9;
      do {
        pAVar24 = local_890;
        if (((pbVar47->super__Base_bitset<4UL>)._M_w[uVar33 >> 6] >> (uVar33 & 0x3f) & 1) != 0) {
          __position._M_current =
               (local_890->_agg).
               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (local_890->_agg).
              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
            _M_realloc_insert<std::bitset<1500ul>const&>
                      ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>> *)local_890,
                       __position,local_868);
          }
          else {
            memcpy(__position._M_current,local_868,0xc0);
            ppbVar1 = &(pAVar24->_agg).
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppbVar1 = *ppbVar1 + 1;
          }
          local_5d8 = (undefined1  [16])0x0;
          local_5e8 = (undefined1  [16])0x0;
          local_608.super__Base_bitset<4UL>._M_w[2] = (pbVar47->super__Base_bitset<4UL>)._M_w[2];
          local_608.super__Base_bitset<4UL>._M_w[3] = (pbVar47->super__Base_bitset<4UL>)._M_w[3];
          local_608.super__Base_bitset<4UL>._M_w[0] = (pbVar47->super__Base_bitset<4UL>)._M_w[0];
          local_608.super__Base_bitset<4UL>._M_w[1] = (pbVar47->super__Base_bitset<4UL>)._M_w[1];
          lVar39 = 0;
          lVar49 = 0;
          lVar36 = 0;
          do {
            auVar48 = *(undefined1 (*) [16])((pbVar47->super__Base_bitset<4UL>)._M_w + lVar36);
            auVar70._0_2_ = auVar48._0_2_ >> 1;
            auVar70._2_2_ = auVar48._2_2_ >> 1;
            auVar70._4_2_ = auVar48._4_2_ >> 1;
            auVar70._6_2_ = auVar48._6_2_ >> 1;
            auVar70._8_2_ = auVar48._8_2_ >> 1;
            auVar70._10_2_ = auVar48._10_2_ >> 1;
            auVar70._12_2_ = auVar48._12_2_ >> 1;
            auVar70._14_2_ = auVar48._14_2_ >> 1;
            auVar70 = auVar70 & _DAT_002b0050;
            uVar51 = CONCAT11(auVar48[1] - auVar70[1],auVar48[0] - auVar70[0]);
            uVar52 = CONCAT13(auVar48[3] - auVar70[3],CONCAT12(auVar48[2] - auVar70[2],uVar51));
            uVar53 = CONCAT15(auVar48[5] - auVar70[5],CONCAT14(auVar48[4] - auVar70[4],uVar52));
            uVar54 = CONCAT17(auVar48[7] - auVar70[7],CONCAT16(auVar48[6] - auVar70[6],uVar53));
            auVar55._0_10_ =
                 CONCAT19(auVar48[9] - auVar70[9],CONCAT18(auVar48[8] - auVar70[8],uVar54));
            auVar55[10] = auVar48[10] - auVar70[10];
            auVar55[0xb] = auVar48[0xb] - auVar70[0xb];
            auVar57[0xc] = auVar48[0xc] - auVar70[0xc];
            auVar57._0_12_ = auVar55;
            auVar57[0xd] = auVar48[0xd] - auVar70[0xd];
            auVar59[0xe] = auVar48[0xe] - auVar70[0xe];
            auVar59._0_14_ = auVar57;
            auVar59[0xf] = auVar48[0xf] - auVar70[0xf];
            auVar70 = auVar59 & _DAT_002b0060;
            auVar48._0_2_ = uVar51 >> 2;
            auVar48._2_2_ = (ushort)((uint)uVar52 >> 0x12);
            auVar48._4_2_ = (ushort)((uint6)uVar53 >> 0x22);
            auVar48._6_2_ = (ushort)((ulong)uVar54 >> 0x32);
            auVar48._8_2_ = (ushort)((unkuint10)auVar55._0_10_ >> 0x42);
            auVar48._10_2_ = auVar55._10_2_ >> 2;
            auVar48._12_2_ = auVar57._12_2_ >> 2;
            auVar48._14_2_ = auVar59._14_2_ >> 2;
            auVar48 = auVar48 & _DAT_002b0060;
            cVar50 = auVar48[0] + auVar70[0];
            bVar61 = auVar48[1] + auVar70[1];
            uVar51 = CONCAT11(bVar61,cVar50);
            cVar62 = auVar48[2] + auVar70[2];
            bVar63 = auVar48[3] + auVar70[3];
            uVar52 = CONCAT13(bVar63,CONCAT12(cVar62,uVar51));
            cVar64 = auVar48[4] + auVar70[4];
            bVar65 = auVar48[5] + auVar70[5];
            uVar53 = CONCAT15(bVar65,CONCAT14(cVar64,uVar52));
            cVar66 = auVar48[6] + auVar70[6];
            bVar67 = auVar48[7] + auVar70[7];
            uVar54 = CONCAT17(bVar67,CONCAT16(cVar66,uVar53));
            cVar68 = auVar48[8] + auVar70[8];
            bVar69 = auVar48[9] + auVar70[9];
            auVar56._0_10_ = CONCAT19(bVar69,CONCAT18(cVar68,uVar54));
            auVar56[10] = auVar48[10] + auVar70[10];
            auVar56[0xb] = auVar48[0xb] + auVar70[0xb];
            auVar58[0xc] = auVar48[0xc] + auVar70[0xc];
            auVar58._0_12_ = auVar56;
            auVar58[0xd] = auVar48[0xd] + auVar70[0xd];
            auVar60[0xe] = auVar48[0xe] + auVar70[0xe];
            auVar60._0_14_ = auVar58;
            auVar60[0xf] = auVar48[0xf] + auVar70[0xf];
            auVar71[0] = (char)(uVar51 >> 4) + cVar50;
            auVar71[1] = (bVar61 >> 4) + bVar61;
            auVar71[2] = (char)(ushort)((uint)uVar52 >> 0x14) + cVar62;
            auVar71[3] = (bVar63 >> 4) + bVar63;
            auVar71[4] = (char)(ushort)((uint6)uVar53 >> 0x24) + cVar64;
            auVar71[5] = (bVar65 >> 4) + bVar65;
            auVar71[6] = (char)(ushort)((ulong)uVar54 >> 0x34) + cVar66;
            auVar71[7] = (bVar67 >> 4) + bVar67;
            auVar71[8] = (char)(ushort)((unkuint10)auVar56._0_10_ >> 0x44) + cVar68;
            auVar71[9] = (bVar69 >> 4) + bVar69;
            auVar71[10] = (char)(auVar56._10_2_ >> 4) + auVar56[10];
            auVar71[0xb] = (auVar56[0xb] >> 4) + auVar56[0xb];
            auVar71[0xc] = (char)(auVar58._12_2_ >> 4) + auVar58[0xc];
            auVar71[0xd] = (auVar58[0xd] >> 4) + auVar58[0xd];
            auVar71[0xe] = (char)(auVar60._14_2_ >> 4) + auVar60[0xe];
            auVar71[0xf] = (auVar60[0xf] >> 4) + auVar60[0xf];
            auVar48 = psadbw(auVar71 & _DAT_002b0070,(undefined1  [16])0x0);
            lVar39 = lVar39 + auVar48._0_8_;
            lVar49 = lVar49 + auVar48._8_8_;
            lVar36 = lVar36 + 2;
          } while (lVar36 != 4);
          local_888 = uVar33;
          if (((ulong)(lVar49 + lVar39) < 2) || (node->_numOfNeighbors == 0)) {
            local_8a0 = 0;
            bVar25 = false;
          }
          else {
            local_858 = 0;
            bVar25 = false;
            local_8a0 = 0;
            do {
              uVar40 = uVar33;
              if (uVar33 < 199) {
                do {
                  pbVar27 = local_830.
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  uVar41 = uVar40 + 1;
                  _Var38 = uVar40;
                  if ((local_608.super__Base_bitset<4UL>._M_w[uVar41 >> 6] >> (uVar41 & 0x3f) & 1)
                      != 0) {
                    pbVar43 = (aggregate->
                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    __src_00 = pbVar43 + uVar33;
                    __src = local_830.
                            super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + local_8a0;
                    local_848 = uVar40;
                    local_818 = 1L << ((byte)uVar41 & 0x3f);
                    memcpy(local_7d8,__src_00,0xc0);
                    _Var38 = local_858;
                    lVar36 = 0;
                    do {
                      puVar6 = (ulong *)((long)(pbVar27->super__Base_bitset<24UL>)._M_w +
                                        lVar36 * 8 + local_858);
                      uVar33 = puVar6[1];
                      uVar40 = *(ulong *)(local_7d8 + lVar36 * 8 + 8);
                      *(ulong *)(local_7d8 + lVar36 * 8) =
                           *(ulong *)(local_7d8 + lVar36 * 8) & *puVar6;
                      *(ulong *)(local_7d8 + lVar36 * 8 + 8) = uVar40 & uVar33;
                      lVar36 = lVar36 + 2;
                    } while (lVar36 != 0x18);
                    pbVar43 = pbVar43 + uVar41;
                    memcpy(&local_6e8,pbVar43,0xc0);
                    uVar33 = local_888;
                    lVar36 = 0;
                    do {
                      *(undefined1 (*) [16])(local_6e8.super__Base_bitset<24UL>._M_w + lVar36) =
                           *(undefined1 (*) [16])(local_6e8.super__Base_bitset<24UL>._M_w + lVar36)
                           & *(undefined1 (*) [16])
                              ((long)(pbVar27->super__Base_bitset<24UL>)._M_w + lVar36 * 8 + _Var38)
                      ;
                      lVar36 = lVar36 + 2;
                    } while (lVar36 != 0x18);
                    if (local_7d8._0_8_ == local_6e8.super__Base_bitset<24UL>._M_w[0]) {
                      uVar40 = 0xffffffffffffffff;
                      do {
                        if (uVar40 == 0x16) {
                          uVar35 = 0x17;
                          break;
                        }
                        lVar36 = uVar40 * 8;
                        uVar35 = uVar40 + 1;
                        lVar39 = uVar40 + 2;
                        uVar40 = uVar35;
                      } while (*(_WordT *)(local_7c8 + lVar36) ==
                               local_6e8.super__Base_bitset<24UL>._M_w[lVar39]);
                      _Var38 = local_848;
                      if (0x16 < uVar35) goto LAB_0029fb83;
                    }
                    memcpy(local_7d8,__src,0xc0);
                    lVar36 = 0;
                    do {
                      lVar39 = lVar36 * 8;
                      uVar15 = *(uint *)(local_7d8 + lVar39 + 4);
                      uVar16 = *(uint *)(local_7d8 + lVar39 + 8);
                      uVar17 = *(uint *)(local_7c8 + lVar39 + -4);
                      lVar49 = lVar36 * 8;
                      *(uint *)(local_7d8 + lVar49) = *(uint *)(local_7d8 + lVar39) ^ 0xffffffff;
                      *(uint *)(local_7d8 + lVar49 + 4) = uVar15 ^ 0xffffffff;
                      *(uint *)(local_7d8 + lVar49 + 8) = uVar16 ^ 0xffffffff;
                      *(uint *)(local_7c8 + lVar49 + -4) = uVar17 ^ 0xffffffff;
                      lVar36 = lVar36 + 2;
                    } while (lVar36 != 0x18);
                    local_720 = local_720 & 0xfffffff;
                    memcpy(local_578,local_7d8,0xc0);
                    memcpy(&local_6e8,__src_00,0xc0);
                    lVar36 = 0;
                    do {
                      uVar40 = *(ulong *)(local_578 + lVar36 * 8 + 8);
                      uVar35 = local_6e8.super__Base_bitset<24UL>._M_w[lVar36 + 1];
                      local_6e8.super__Base_bitset<24UL>._M_w[lVar36] =
                           local_6e8.super__Base_bitset<24UL>._M_w[lVar36] &
                           *(ulong *)(local_578 + lVar36 * 8);
                      local_6e8.super__Base_bitset<24UL>._M_w[lVar36 + 1] = uVar35 & uVar40;
                      lVar36 = lVar36 + 2;
                    } while (lVar36 != 0x18);
                    memcpy(local_7d8,__src,0xc0);
                    lVar36 = 0;
                    do {
                      lVar39 = lVar36 * 8;
                      uVar15 = *(uint *)(local_7d8 + lVar39 + 4);
                      uVar16 = *(uint *)(local_7d8 + lVar39 + 8);
                      uVar17 = *(uint *)(local_7c8 + lVar39 + -4);
                      lVar49 = lVar36 * 8;
                      *(uint *)(local_7d8 + lVar49) = *(uint *)(local_7d8 + lVar39) ^ 0xffffffff;
                      *(uint *)(local_7d8 + lVar49 + 4) = uVar15 ^ 0xffffffff;
                      *(uint *)(local_7d8 + lVar49 + 8) = uVar16 ^ 0xffffffff;
                      *(uint *)(local_7c8 + lVar49 + -4) = uVar17 ^ 0xffffffff;
                      lVar36 = lVar36 + 2;
                    } while (lVar36 != 0x18);
                    local_720 = local_720 & 0xfffffff;
                    memcpy(local_270,local_7d8,0xc0);
                    memcpy(&local_4b0,pbVar43,0xc0);
                    _Var38 = local_848;
                    lVar36 = 0;
                    do {
                      *(undefined1 (*) [16])(&local_4b0 + lVar36) =
                           *(undefined1 (*) [16])(&local_4b0 + lVar36) &
                           *(undefined1 (*) [16])(local_270 + lVar36 * 8);
                      lVar36 = lVar36 + 2;
                    } while (lVar36 != 0x18);
                    if ((View *)local_6e8.super__Base_bitset<24UL>._M_w[0] == local_4b0) {
                      uVar40 = 0xffffffffffffffff;
                      do {
                        if (uVar40 == 0x16) {
                          uVar35 = 0x17;
                          break;
                        }
                        lVar39 = uVar40 + 2;
                        uVar35 = uVar40 + 1;
                        lVar36 = uVar40 - 0x16;
                        uVar40 = uVar35;
                      } while (local_6e8.super__Base_bitset<24UL>._M_w[lVar39] == local_3f0[lVar36])
                      ;
                      if (0x16 < uVar35) {
                        *(ulong *)(local_5e8 + (uVar41 >> 6) * 8) =
                             *(ulong *)(local_5e8 + (uVar41 >> 6) * 8) | local_818;
                        bVar25 = true;
                      }
                    }
                    std::bitset<200UL>::reset(&local_608,uVar41);
                  }
LAB_0029fb83:
                  uVar40 = uVar41;
                } while (_Var38 < 0xc6);
              }
              if (bVar25) break;
              local_8a0 = local_8a0 + 1;
              local_858 = local_858 + 0xc0;
            } while (local_8a0 < node->_numOfNeighbors);
          }
          pbVar47 = local_860;
          uVar33 = local_888;
          if (node->_numOfNeighbors != 0) {
            lVar36 = 0;
            uVar40 = 0;
            do {
              pbVar27 = local_830.
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((node->_neighbors).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar40] != local_880) {
                memcpy(local_7d8,
                       (aggregate->
                       super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_888,0xc0);
                lVar39 = 0;
                do {
                  puVar6 = (ulong *)((long)(pbVar27->super__Base_bitset<24UL>)._M_w +
                                    lVar39 * 8 + lVar36);
                  uVar33 = puVar6[1];
                  uVar41 = *(ulong *)(local_7d8 + lVar39 * 8 + 8);
                  *(ulong *)(local_7d8 + lVar39 * 8) = *(ulong *)(local_7d8 + lVar39 * 8) & *puVar6;
                  *(ulong *)(local_7d8 + lVar39 * 8 + 8) = uVar41 & uVar33;
                  lVar39 = lVar39 + 2;
                } while (lVar39 != 0x18);
                __l._M_len = 1;
                __l._M_array = (iterator)local_7d8;
                std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
                          ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                           &local_6e8,__l,(allocator_type *)local_578);
                if (uVar40 == local_8a0 && !(bool)(~bVar25 & 1)) {
                  uVar33 = 0;
                  do {
                    pbVar27 = local_830.
                              super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((*(ulong *)(local_5e8 + (uVar33 >> 6) * 8) >> (uVar33 & 0x3f) & 1) != 0) {
                      memcpy(local_7d8,
                             (aggregate->
                             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + uVar33,0xc0);
                      _Var38 = local_6e8.super__Base_bitset<24UL>._M_w[1];
                      lVar39 = 0;
                      do {
                        puVar6 = (ulong *)((long)(pbVar27->super__Base_bitset<24UL>)._M_w +
                                          lVar39 * 8 + lVar36);
                        uVar41 = puVar6[1];
                        uVar35 = *(ulong *)(local_7d8 + lVar39 * 8 + 8);
                        *(ulong *)(local_7d8 + lVar39 * 8) =
                             *(ulong *)(local_7d8 + lVar39 * 8) & *puVar6;
                        *(ulong *)(local_7d8 + lVar39 * 8 + 8) = uVar35 & uVar41;
                        lVar39 = lVar39 + 2;
                      } while (lVar39 != 0x18);
                      if (local_6e8.super__Base_bitset<24UL>._M_w[1] ==
                          local_6e8.super__Base_bitset<24UL>._M_w[2]) {
                        std::vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>::
                        _M_realloc_insert<std::bitset<1500ul>>
                                  ((vector<std::bitset<1500ul>,std::allocator<std::bitset<1500ul>>>
                                    *)&local_6e8,
                                   (iterator)local_6e8.super__Base_bitset<24UL>._M_w[1],
                                   (bitset<1500UL> *)local_7d8);
                      }
                      else {
                        memcpy((void *)local_6e8.super__Base_bitset<24UL>._M_w[1],local_7d8,0xc0);
                        local_6e8.super__Base_bitset<24UL>._M_w[1] = _Var38 + 0xc0;
                      }
                      std::bitset<200UL>::reset(local_860,uVar33);
                    }
                    uVar33 = uVar33 + 1;
                  } while (uVar33 != 200);
                }
                node_00 = TreeDecomposition::getRelation
                                    ((this->_td).
                                     super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,(node->_neighbors).
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar40]);
                pAVar24 = local_890;
                local_848 = local_878.super__Base_bitset<2UL>._M_w[0];
                _Stack_840 = local_878.super__Base_bitset<2UL>._M_w[1];
                local_858 = local_7f0.
                            super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_888].
                            super__Base_bitset<2UL>._M_w[0];
                _Stack_850 = local_7f0.
                             super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[local_888].
                             super__Base_bitset<2UL>._M_w[1];
                local_618 = node->_neighborSchema[uVar40].super__Base_bitset<2UL>._M_w[0];
                _Stack_610 = node->_neighborSchema[uVar40].super__Base_bitset<2UL>._M_w[1];
                local_818 = (node_00->_bag).super__Base_bitset<2UL>._M_w[0];
                _Stack_810 = (node_00->_bag).super__Base_bitset<2UL>._M_w[1];
                local_628 = (node->_bag).super__Base_bitset<2UL>._M_w[0];
                _Stack_620 = (node->_bag).super__Base_bitset<2UL>._M_w[1];
                sVar44 = node->_id;
                std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::vector
                          (&local_5c8,
                           (vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
                           &local_6e8);
                auVar19._8_8_ = _Stack_840;
                auVar19._0_8_ = local_848;
                auVar18._8_8_ = _Stack_850;
                auVar18._0_8_ = local_858;
                auVar22._8_8_ = _Stack_610;
                auVar22._0_8_ = local_618;
                auVar20._8_8_ = _Stack_810;
                auVar20._0_8_ = local_818;
                auVar21._8_8_ = _Stack_620;
                auVar21._0_8_ = local_628;
                local_7d8 = (undefined1  [16])
                            compileViews(this,node_00,sVar44,&local_5c8,
                                         (var_bitset)
                                         (auVar20 & auVar21 | (auVar19 | auVar18) & auVar22));
                __position_00._M_current =
                     (pAVar24->_incoming).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position_00._M_current ==
                    (pAVar24->_incoming).
                    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::
                  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                  ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                            ((vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                              *)&pAVar24->_incoming,__position_00,
                             (pair<unsigned_long,_unsigned_long> *)local_7d8);
                }
                else {
                  (__position_00._M_current)->first = local_7d8._0_8_;
                  (__position_00._M_current)->second = local_7d8._8_8_;
                  pppVar2 = &(pAVar24->_incoming).
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *pppVar2 = *pppVar2 + 1;
                }
                if (local_5c8.
                    super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_5c8.
                                  super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                if ((View *)local_6e8.super__Base_bitset<24UL>._M_w[0] != (View *)0x0) {
                  operator_delete((void *)local_6e8.super__Base_bitset<24UL>._M_w[0]);
                }
              }
              uVar40 = uVar40 + 1;
              lVar36 = lVar36 + 0xc0;
              pbVar47 = local_860;
              uVar33 = local_888;
            } while (uVar40 < node->_numOfNeighbors);
          }
        }
        uVar33 = uVar33 + 1;
      } while (uVar33 != 200);
      p_Var9 = local_7f8->_M_nxt;
    }
    local_7d8._8_8_ = local_878.super__Base_bitset<2UL>._M_w[1];
    local_7d8._0_8_ = local_878.super__Base_bitset<2UL>._M_w[0];
    local_7c8._4_4_ = (int)node->_id;
    local_7c8._0_4_ = (int)local_880;
    iVar30 = std::
             _Hashtable<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(&(this->_viewCache)._M_h,(key_type *)local_7d8);
    if (iVar30.
        super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_6e8.super__Base_bitset<24UL>._M_w[0] = (_WordT)operator_new(0x38);
      ((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_origin = (uint)node->_id;
      ((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_destination = (uint)local_880;
      (((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates).
      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates).
      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      (((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates).
      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_fVars).super__Base_bitset<2UL>._M_w[0]
           = local_878.super__Base_bitset<2UL>._M_w[0];
      (((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_fVars).super__Base_bitset<2UL>._M_w[1]
           = local_878.super__Base_bitset<2UL>._M_w[1];
      ppAVar10 = (((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates).
                 super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (ppAVar10 == (pointer)0x0) {
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)
                   &((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates,(iterator)0x0,
                   &local_890);
      }
      else {
        *ppAVar10 = local_890;
        pppAVar3 = &(((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppAVar3 = *pppAVar3 + 1;
      }
      __position_02._M_current =
           (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_02._M_current ==
          (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<View*,std::allocator<View*>>::_M_realloc_insert<View*const&>
                  ((vector<View*,std::allocator<View*>> *)&this->_viewList,__position_02,
                   (View **)&local_6e8);
      }
      else {
        *__position_02._M_current = (View *)local_6e8.super__Base_bitset<24UL>._M_w[0];
        pppVVar4 = &(this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppVVar4 = *pppVVar4 + 1;
      }
      ppVVar11 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppVVar12 = (this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      pmVar31 = std::__detail::
                _Map_base<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::tuple<int,_int,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->_viewCache,(key_type *)local_7d8);
      *pmVar31 = (int)((ulong)((long)ppVVar12 - (long)ppVVar11) >> 3) + -1;
      uVar46 = ((long)(this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) - 1;
      uVar37 = 0;
    }
    else {
      local_6e8.super__Base_bitset<24UL>._M_w[0] =
           (_WordT)(this->_viewList).super__Vector_base<View_*,_std::allocator<View_*>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [*(int *)((long)iVar30.
                                   super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
                                   ._M_cur + 0x20)];
      __position_01._M_current =
           (((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates).
           super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position_01._M_current ==
          (((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates).
          super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Aggregate*,std::allocator<Aggregate*>>::_M_realloc_insert<Aggregate*const&>
                  ((vector<Aggregate*,std::allocator<Aggregate*>> *)
                   &((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates,__position_01,
                   &local_890);
      }
      else {
        *__position_01._M_current = local_890;
        pppAVar3 = &(((View *)local_6e8.super__Base_bitset<24UL>._M_w[0])->_aggregates).
                    super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        *pppAVar3 = *pppAVar3 + 1;
      }
      uVar37 = ((long)(((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                       (local_6e8.super__Base_bitset<24UL>._M_w[0] + 0x20))->
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(((vector<Aggregate_*,_std::allocator<Aggregate_*>_> *)
                       (local_6e8.super__Base_bitset<24UL>._M_w[0] + 0x20))->
                      super__Vector_base<Aggregate_*,_std::allocator<Aggregate_*>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) - 1;
      uVar46 = (unsigned_long)
               *(int *)((long)iVar30.
                              super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::bitset<100UL>_>,_int>,_true>
                              ._M_cur + 0x20);
    }
    pmVar32 = std::__detail::
              _Map_base<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_std::allocator<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::hash<std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](local_800,(key_type *)local_718);
    pmVar32->first = (int)uVar46;
    pmVar32->second = (int)uVar37;
    std::
    _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_std::bitset<200UL>_>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_5b0);
    if (local_7f0.super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_7f0.
                      super__Vector_base<std::bitset<100UL>,_std::allocator<std::bitset<100UL>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_830.super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_830.
                      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    uVar46 = (unsigned_long)
             *(int *)((long)iVar26.
                            super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
                            ._M_cur + 0x38);
    uVar37 = (unsigned_long)
             *(int *)((long)iVar26.
                            super__Node_iterator_base<std::pair<const_std::tuple<int,_int,_std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::bitset<100UL>_>,_std::pair<int,_int>_>,_true>
                            ._M_cur + 0x3c);
  }
  if ((pointer)local_718._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_718._16_8_);
  }
  pVar72.second = uVar37;
  pVar72.first = uVar46;
  return pVar72;
}

Assistant:

pair<size_t,size_t> QueryCompiler::compileViews(TDNode* node, size_t destinationID,
                                   vector<prod_bitset> aggregate, var_bitset freeVars)
{
    bool print = false;
    
    /* Check if the required view has already been declared - if so reuse this one */
    cache_tuple t = make_tuple(node->_id, destinationID, aggregate, freeVars);
    auto it = _cache.find(t);
    if (it != _cache.end())
    {
        if (print) 
            DINFO("We reused an existing view. \n");      
        return it->second;
    }

    
    if (print)
    {
        DINFO("\nBeginning compileViews at node " + to_string(node->_id) + " destination "+
              to_string(destinationID) + " freeVars: " + freeVars.to_string() +
              " number of products: " + to_string(aggregate.size()) +"\n");

        std::string aggString = " ";
        size_t aggIdx = 0;
        for (size_t i = 0; i < aggregate.size(); i++) {
            const auto &prod = aggregate[aggIdx];
            for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++) {
                if (prod.test(f)) {
                    Function* func = getFunction(f);
                    aggString += "f_"+to_string(f)+"(";
                    for (size_t i = 0; i < NUM_OF_VARIABLES; i++)
                        if (func->_fVars.test(i))
                            aggString += _td->getAttribute(i)->_name;
                    aggString += ")*";
                }
            }
            aggString.pop_back();
            aggString += " + ";
            ++aggIdx;
        }
        aggString.pop_back();
        printf("%s\n", aggString.c_str());
    }
    
    vector<prod_bitset> pushDownMask(node->_numOfNeighbors);
    prod_bitset localMask, forcedLocalFunctions, remainderMask, presentFunctions;

    // Find all functions in the aggregate 
    for (size_t prod = 0; prod < aggregate.size(); prod++)
        presentFunctions |= aggregate[prod];

    for (size_t i = 0; i < NUM_OF_FUNCTIONS; i++)
    {
        if (presentFunctions[i])
        {            
            const var_bitset& fVars = _functionList[i]->_fVars;
            bool pushedDown = false;

            /*
             * Check if that function is included in the local bag
             * - if so, then we do not push it down 
             */
            if ((node->_bag & fVars) == fVars)
            {
                /* Leave it here as local computation */
                localMask.set(i);
            }
            else
            {
                /* For each child of current node */
                for (size_t c = 0; c < node->_numOfNeighbors; c++)
                {
                    /* chekc that this neighbor is not the destination */
                    if (node->_neighbors[c] != destinationID)
                    {
                        /* childSchema contains the function then push down */
                        if ((node->_neighborSchema[c] & fVars) == fVars)
                        {
                            /* push it to this child */
                            pushDownMask[c].set(i);
                            remainderMask.set(i);
                            pushedDown = true;
                            break;
                        }
                    }
                }

                if (!pushedDown)
                {
                    /* Leave it here as local computation */
                    localMask.set(i);
                    forcedLocalFunctions.set(i);
                }
            }
        }
    }
    
    vector<var_bitset> pushDownFreeVars(aggregate.size(), freeVars);
    
    std::unordered_map<prod_bitset, agg_bitset> localAggMap;


    /* 
     * For each product - split the functions into the ones that are pushed down
     * and the local functions 
     */
    for (size_t prod = 0; prod < aggregate.size(); prod++)
    {
        // Add freeVars that do not exist in local bag to pushDownFreeVars
        prod_bitset forcedLocal = aggregate[prod] & forcedLocalFunctions;
        
        for (size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
        {
            if (forcedLocal[f])
            {
                pushDownFreeVars[prod] |=
                    _functionList[f]->_fVars & ~node->_bag;
            }
        }
        
        prod_bitset localAggregate = aggregate[prod] & localMask;
        
        // add this product to localAggregates
        auto it = localAggMap.find(localAggregate);
        if (it != localAggMap.end())
        {
            it->second.set(prod);
        }
        else
        {
            localAggMap[localAggregate] = agg_bitset().set(prod);
        }
    }
  
    if (print)
    {
        size_t localAggIndex = 0;
        for (pair<const prod_bitset, agg_bitset>& localAgg : localAggMap)
            std::cout << localAggIndex++ << " : " << localAgg.first 
                      << " -> " << localAgg.second << std::endl;
    }


    Aggregate* agg = new Aggregate();

    /* 
     * We now computed the local aggregates and the groups of products they
     * correspond to - now we check if we can merge several products before the
     * recursion 
     */
    size_t localAggIndex = 0;
    for (pair<const prod_bitset, agg_bitset>& localAgg : localAggMap)
    {
        if (print)
            std::cout << localAggIndex++ << " : " << localAgg.first 
                      << " -> " << localAgg.second << std::endl;
        
        for (size_t prod = 0; prod < NUM_OF_PRODUCTS; ++prod)
        {
            if (localAgg.second[prod])
            {
                if (print)
                    std::cout << prod << std::endl;
                
                // Push local aggregate on aggregate
                agg->_agg.push_back(localAgg.first);
                
                size_t neigh = 0;
                bool mergable = false;

                // Check if we can merge some of the products that need to be
                // computed below
                agg_bitset merges, candidate = localAgg.second;

                if (localAgg.second.count() > 1)
                {
                    for (neigh = 0; neigh < node->_numOfNeighbors; ++neigh)
                    {
                        for (size_t other_prod = prod+1; other_prod < NUM_OF_PRODUCTS;
                             ++other_prod)
                        {
                            if (candidate[other_prod])
                            {
                                if ((aggregate[prod] & pushDownMask[neigh]) !=
                                    (aggregate[other_prod] & pushDownMask[neigh]))
                                {
                                    if ((aggregate[prod] & ~pushDownMask[neigh]) ==
                                        (aggregate[other_prod] & ~pushDownMask[neigh]))
                                    {
                                        merges.set(other_prod);
                                        mergable = true;
                                    }

                                    candidate.reset(other_prod);
                                }
                            }
                        }

                        if (mergable)
                            break;                        
                    }
                }

                // For each neighbor compile the (merged) views and push to incoming
                for (size_t n = 0; n < node->_numOfNeighbors; ++n)
                {
                    if (node->_neighbors[n] != destinationID)
                    {
                        vector<prod_bitset> childAgg =
                            {aggregate[prod] & pushDownMask[n]};
                        
                        if (mergable && n == neigh)
                        {  
                            for (size_t other = 0; other < NUM_OF_PRODUCTS; ++other)
                            {
                                if (merges[other])
                                {     
                                    /* Add mergable products to this array */
                                    childAgg.push_back(
                                        aggregate[other] & pushDownMask[n]);
                                    
                                    /* And unset for the flag in localAgg.second */
                                    localAgg.second.reset(other);
                                }
                            }
                        }

                        TDNode* neighbor = _td->getRelation(node->_neighbors[n]);

                        var_bitset neighborFreeVars =
                            ((freeVars | pushDownFreeVars[prod]) &
                             node->_neighborSchema[n]) |
                            (neighbor->_bag & node->_bag);

                        /* Recursive call for the next child */ 
                        agg->_incoming.push_back(
                             compileViews(neighbor, node->_id, childAgg, neighborFreeVars));
                    }
                }
            }
        }
    }

    /* 
     * Check here if a View with the same node, destination and freeVars exists 
     * if so then we want to append this aggregate to the exisiting view
     */
    View* view;
    view_tuple vt = make_tuple(node->_id, destinationID, freeVars);
    pair<size_t, size_t> viewAggregatePair;
    
    auto view_it = _viewCache.find(vt);
    if (view_it != _viewCache.end())
    {
        /* If the required view has already been declared, we append the
         * aggregate to this view 
         */

        view = _viewList[view_it->second];
        
        view->_aggregates.push_back(agg);

        /* Used for caching entire view and aggregate */
        viewAggregatePair =  make_pair(view_it->second, view->_aggregates.size()-1);
    }
    else
    {
        /* 
         * If the required view has not already been declared, we construct a
         * new view and the aggregate to it
         */
        view = new View(node->_id, destinationID);
        
        view->_fVars = freeVars;
        view->_aggregates.push_back(agg);

        /* Adding local view to the list of views */
        _viewList.push_back(view);

        /* Cache this view structure */
        _viewCache[vt] = _viewList.size()-1;

        /* Used for caching entire view and aggregate */
        viewAggregatePair =  make_pair(_viewList.size()-1, 0);
    }
    
    /* Adding the  view for the entire subtree to the cache */ 
    _cache[t] = viewAggregatePair;
    
    /* Return ID of this view */  
    return viewAggregatePair;    
}